

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001cce90 = 0x2e2e2e2e2e2e2e;
    uRam00000000001cce97._0_1_ = '.';
    uRam00000000001cce97._1_1_ = '.';
    uRam00000000001cce97._2_1_ = '.';
    uRam00000000001cce97._3_1_ = '.';
    uRam00000000001cce97._4_1_ = '.';
    uRam00000000001cce97._5_1_ = '.';
    uRam00000000001cce97._6_1_ = '.';
    uRam00000000001cce97._7_1_ = '.';
    DAT_001cce80 = '.';
    DAT_001cce80_1._0_1_ = '.';
    DAT_001cce80_1._1_1_ = '.';
    DAT_001cce80_1._2_1_ = '.';
    DAT_001cce80_1._3_1_ = '.';
    DAT_001cce80_1._4_1_ = '.';
    DAT_001cce80_1._5_1_ = '.';
    DAT_001cce80_1._6_1_ = '.';
    uRam00000000001cce88 = 0x2e2e2e2e2e2e2e;
    DAT_001cce8f = 0x2e;
    DAT_001cce70 = '.';
    DAT_001cce70_1._0_1_ = '.';
    DAT_001cce70_1._1_1_ = '.';
    DAT_001cce70_1._2_1_ = '.';
    DAT_001cce70_1._3_1_ = '.';
    DAT_001cce70_1._4_1_ = '.';
    DAT_001cce70_1._5_1_ = '.';
    DAT_001cce70_1._6_1_ = '.';
    uRam00000000001cce78._0_1_ = '.';
    uRam00000000001cce78._1_1_ = '.';
    uRam00000000001cce78._2_1_ = '.';
    uRam00000000001cce78._3_1_ = '.';
    uRam00000000001cce78._4_1_ = '.';
    uRam00000000001cce78._5_1_ = '.';
    uRam00000000001cce78._6_1_ = '.';
    uRam00000000001cce78._7_1_ = '.';
    DAT_001cce60 = '.';
    DAT_001cce60_1._0_1_ = '.';
    DAT_001cce60_1._1_1_ = '.';
    DAT_001cce60_1._2_1_ = '.';
    DAT_001cce60_1._3_1_ = '.';
    DAT_001cce60_1._4_1_ = '.';
    DAT_001cce60_1._5_1_ = '.';
    DAT_001cce60_1._6_1_ = '.';
    uRam00000000001cce68._0_1_ = '.';
    uRam00000000001cce68._1_1_ = '.';
    uRam00000000001cce68._2_1_ = '.';
    uRam00000000001cce68._3_1_ = '.';
    uRam00000000001cce68._4_1_ = '.';
    uRam00000000001cce68._5_1_ = '.';
    uRam00000000001cce68._6_1_ = '.';
    uRam00000000001cce68._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001cce58._0_1_ = '.';
    uRam00000000001cce58._1_1_ = '.';
    uRam00000000001cce58._2_1_ = '.';
    uRam00000000001cce58._3_1_ = '.';
    uRam00000000001cce58._4_1_ = '.';
    uRam00000000001cce58._5_1_ = '.';
    uRam00000000001cce58._6_1_ = '.';
    uRam00000000001cce58._7_1_ = '.';
    DAT_001cce9f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}